

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_get_entry_points
          (spvc_compiler compiler,spvc_entry_point **entry_points,size_t *num_entry_points)

{
  spvc_context_s *this;
  spvc_context psVar1;
  pointer this_00;
  size_t sVar2;
  EntryPoint *pEVar3;
  pointer pTVar4;
  spvc_entry_point *psVar5;
  exception *e;
  unique_ptr<TemporaryBuffer<spvc_entry_point>,_std::default_delete<TemporaryBuffer<spvc_entry_point>_>_>
  local_288;
  unique_ptr<TemporaryBuffer<spvc_entry_point>,_std::default_delete<TemporaryBuffer<spvc_entry_point>_>_>
  ptr;
  string local_278;
  undefined1 local_258 [8];
  spvc_entry_point new_entry;
  EntryPoint *entry;
  EntryPoint *__end1;
  EntryPoint *__begin1;
  SmallVector<spirv_cross::EntryPoint,_8UL> *__range1;
  SmallVector<spvc_entry_point,_8UL> translated;
  undefined1 local_180 [8];
  SmallVector<spirv_cross::EntryPoint,_8UL> entries;
  size_t *num_entry_points_local;
  spvc_entry_point **entry_points_local;
  spvc_compiler compiler_local;
  
  entries.stack_storage.aligned_char._312_8_ = num_entry_points;
  this_00 = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
            operator->(&compiler->compiler);
  spirv_cross::Compiler::get_entry_points_and_stages
            ((SmallVector<spirv_cross::EntryPoint,_8UL> *)local_180,this_00);
  spirv_cross::SmallVector<spvc_entry_point,_8UL>::SmallVector
            ((SmallVector<spvc_entry_point,_8UL> *)&__range1);
  sVar2 = spirv_cross::VectorView<spirv_cross::EntryPoint>::size
                    ((VectorView<spirv_cross::EntryPoint> *)local_180);
  spirv_cross::SmallVector<spvc_entry_point,_8UL>::reserve
            ((SmallVector<spvc_entry_point,_8UL> *)&__range1,sVar2);
  __end1 = spirv_cross::VectorView<spirv_cross::EntryPoint>::begin
                     ((VectorView<spirv_cross::EntryPoint> *)local_180);
  pEVar3 = spirv_cross::VectorView<spirv_cross::EntryPoint>::end
                     ((VectorView<spirv_cross::EntryPoint> *)local_180);
  do {
    if (__end1 == pEVar3) {
      spvc_allocate<TemporaryBuffer<spvc_entry_point>>();
      pTVar4 = std::
               unique_ptr<TemporaryBuffer<spvc_entry_point>,_std::default_delete<TemporaryBuffer<spvc_entry_point>_>_>
               ::operator->(&local_288);
      spirv_cross::SmallVector<spvc_entry_point,_8UL>::operator=
                (&pTVar4->buffer,(SmallVector<spvc_entry_point,_8UL> *)&__range1);
      pTVar4 = std::
               unique_ptr<TemporaryBuffer<spvc_entry_point>,_std::default_delete<TemporaryBuffer<spvc_entry_point>_>_>
               ::operator->(&local_288);
      psVar5 = spirv_cross::VectorView<spvc_entry_point>::data
                         (&(pTVar4->buffer).super_VectorView<spvc_entry_point>);
      *entry_points = psVar5;
      pTVar4 = std::
               unique_ptr<TemporaryBuffer<spvc_entry_point>,_std::default_delete<TemporaryBuffer<spvc_entry_point>_>_>
               ::operator->(&local_288);
      sVar2 = spirv_cross::VectorView<spvc_entry_point>::size
                        (&(pTVar4->buffer).super_VectorView<spvc_entry_point>);
      *(size_t *)entries.stack_storage.aligned_char._312_8_ = sVar2;
      psVar1 = compiler->context;
      std::unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>>::
      unique_ptr<TemporaryBuffer<spvc_entry_point>,std::default_delete<TemporaryBuffer<spvc_entry_point>>,void>
                ((unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>> *
                 )&e,&local_288);
      spirv_cross::
      SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
      ::push_back(&psVar1->allocations,
                  (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                   *)&e);
      std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>::
      ~unique_ptr((unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                   *)&e);
      std::
      unique_ptr<TemporaryBuffer<spvc_entry_point>,_std::default_delete<TemporaryBuffer<spvc_entry_point>_>_>
      ::~unique_ptr(&local_288);
      ptr._M_t.
      super___uniq_ptr_impl<TemporaryBuffer<spvc_entry_point>,_std::default_delete<TemporaryBuffer<spvc_entry_point>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_TemporaryBuffer<spvc_entry_point>_*,_std::default_delete<TemporaryBuffer<spvc_entry_point>_>_>
      .super__Head_base<0UL,_TemporaryBuffer<spvc_entry_point>_*,_false>._M_head_impl._0_4_ = 0;
LAB_003558f3:
      spirv_cross::SmallVector<spvc_entry_point,_8UL>::~SmallVector
                ((SmallVector<spvc_entry_point,_8UL> *)&__range1);
      spirv_cross::SmallVector<spirv_cross::EntryPoint,_8UL>::~SmallVector
                ((SmallVector<spirv_cross::EntryPoint,_8UL> *)local_180);
      if ((int)ptr._M_t.
               super___uniq_ptr_impl<TemporaryBuffer<spvc_entry_point>,_std::default_delete<TemporaryBuffer<spvc_entry_point>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_TemporaryBuffer<spvc_entry_point>_*,_std::default_delete<TemporaryBuffer<spvc_entry_point>_>_>
               .super__Head_base<0UL,_TemporaryBuffer<spvc_entry_point>_*,_false>._M_head_impl == 0)
      {
        compiler_local._4_4_ = SPVC_SUCCESS;
      }
      return compiler_local._4_4_;
    }
    new_entry.name = (char *)__end1;
    local_258._0_4_ = __end1->execution_model;
    new_entry._0_8_ = spvc_context_s::allocate_name(compiler->context,&__end1->name);
    if ((char *)new_entry._0_8_ == (char *)0x0) {
      this = compiler->context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_278,"Out of memory.",
                 (allocator *)
                 ((long)&ptr._M_t.
                         super___uniq_ptr_impl<TemporaryBuffer<spvc_entry_point>,_std::default_delete<TemporaryBuffer<spvc_entry_point>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_TemporaryBuffer<spvc_entry_point>_*,_std::default_delete<TemporaryBuffer<spvc_entry_point>_>_>
                         .super__Head_base<0UL,_TemporaryBuffer<spvc_entry_point>_*,_false>.
                         _M_head_impl + 7));
      spvc_context_s::report_error(this,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&ptr._M_t.
                         super___uniq_ptr_impl<TemporaryBuffer<spvc_entry_point>,_std::default_delete<TemporaryBuffer<spvc_entry_point>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_TemporaryBuffer<spvc_entry_point>_*,_std::default_delete<TemporaryBuffer<spvc_entry_point>_>_>
                         .super__Head_base<0UL,_TemporaryBuffer<spvc_entry_point>_*,_false>.
                         _M_head_impl + 7));
      compiler_local._4_4_ = SPVC_ERROR_OUT_OF_MEMORY;
      ptr._M_t.
      super___uniq_ptr_impl<TemporaryBuffer<spvc_entry_point>,_std::default_delete<TemporaryBuffer<spvc_entry_point>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_TemporaryBuffer<spvc_entry_point>_*,_std::default_delete<TemporaryBuffer<spvc_entry_point>_>_>
      .super__Head_base<0UL,_TemporaryBuffer<spvc_entry_point>_*,_false>._M_head_impl._0_4_ = 1;
      goto LAB_003558f3;
    }
    spirv_cross::SmallVector<spvc_entry_point,_8UL>::push_back
              ((SmallVector<spvc_entry_point,_8UL> *)&__range1,(spvc_entry_point *)local_258);
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

spvc_result spvc_compiler_get_entry_points(spvc_compiler compiler, const spvc_entry_point **entry_points,
                                           size_t *num_entry_points)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto entries = compiler->compiler->get_entry_points_and_stages();
		SmallVector<spvc_entry_point> translated;
		translated.reserve(entries.size());

		for (auto &entry : entries)
		{
			spvc_entry_point new_entry;
			new_entry.execution_model = static_cast<SpvExecutionModel>(entry.execution_model);
			new_entry.name = compiler->context->allocate_name(entry.name);
			if (!new_entry.name)
			{
				compiler->context->report_error("Out of memory.");
				return SPVC_ERROR_OUT_OF_MEMORY;
			}
			translated.push_back(new_entry);
		}

		auto ptr = spvc_allocate<TemporaryBuffer<spvc_entry_point>>();
		ptr->buffer = std::move(translated);
		*entry_points = ptr->buffer.data();
		*num_entry_points = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}